

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::reserve
          (QList<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this_00;
  qsizetype qVar3;
  X509CertificateExtension *e;
  X509CertificateExtension *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
  *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
  *in_stack_ffffffffffffff80;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
  *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
  *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
            capacity((QList<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)0x13e36f);
  qVar3 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
          freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar3) {
    QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::operator->
              (in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::flags
                   (in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_0013e512;
    QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::operator->
              (in_RDI);
    bVar1 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::isShared
                      (in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::operator->
                (in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::setFlag
                ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
                 0x13e416,(ArrayOptions)f.i);
      goto LAB_0013e512;
    }
  }
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (X509CertificateExtension *)0xaaaaaaaaaaaaaaaa;
  local_38.size = -0x5555555555555556;
  local_40 = size((QList<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (X509CertificateExtension *)
      QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::operator->
                (&local_38);
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::operator->(in_RDI);
  b = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::begin
                ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
                 0x13e496);
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::operator->(in_RDI);
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::end
            ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)e);
  QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
  copyAppend(in_stack_ffffffffffffff90,b,e);
  pDVar4 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::d_ptr
                     (&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
         QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::operator->
                   (&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::setFlag
              ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
               0x13e4f9,(QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
                        SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::swap
            ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)e,
             in_stack_ffffffffffffff78);
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::~QArrayDataPointer
            ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)e);
LAB_0013e512:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}